

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

int __thiscall
capnp::SchemaLoader::BrandedInitializerImpl::init(BrandedInitializerImpl *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar1;
  Fault f;
  Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> lock;
  RawBrandedSchema *mutableSchema;
  DebugComparison<capnp::_::RawBrandedSchema_*&,_const_capnp::_::RawBrandedSchema_*&> _kjCondition;
  Fault local_80;
  undefined1 local_78 [24];
  RawBrandedSchema *local_60;
  DebugComparison<capnp::_::RawBrandedSchema_*&,_const_capnp::_::RawBrandedSchema_*&> local_58;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_28;
  
  local_60 = (RawBrandedSchema *)ctx;
  capnp::_::RawSchema::ensureInitialized(*(RawSchema **)ctx);
  kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)local_78,
             this->loader);
  if (*(long *)(ctx + 0x20) != 0) {
    local_58.left = *(RawBrandedSchema ***)ctx;
    local_58.right = *(RawBrandedSchema ***)(ctx + 8);
    kj::
    Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
    ::find<0ul,capnp::(anonymous_namespace)::SchemaBindingsPair&>
              ((Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
                *)&local_80,
               (SchemaBindingsPair *)
               (*(Maybe<kj::_::Mutex::Waiter_&> **)(local_78._8_8_ + 8) + 0x16));
    if (local_80.exception == (Exception *)0x0) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x841,FAILED,
                 "lock->get()->brands.find(SchemaBindingsPair { schema->generic, schema->scopes }) != nullptr"
                 ,"");
      kj::_::Debug::Fault::fatal((Fault *)&local_58);
    }
    local_78._16_8_ = ((local_80.exception)->ownFile).content.disposer;
    local_58.left = (RawBrandedSchema **)(local_78 + 0x10);
    local_58.right = &local_60;
    local_58.op.content.ptr = " == ";
    local_58.op.content.size_ = 5;
    local_58.result = (EVP_PKEY_CTX *)local_78._16_8_ == ctx;
    if (!local_58.result) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::RawBrandedSchema*&,capnp::_::RawBrandedSchema_const*&>&>
                (&local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x842,FAILED,"mutableSchema == schema","_kjCondition,",&local_58);
      kj::_::Debug::Fault::fatal(&local_80);
    }
    local_28.ptr.field_1.value.ptr = (Scope *)*(undefined8 *)(local_78._16_8_ + 8);
    local_28.ptr.field_1.value.size_ = (size_t)*(uint *)(local_78._16_8_ + 0x18);
    local_28.ptr.isSet = true;
    AVar1 = Impl::makeBrandedDependencies
                      (*(Impl **)(local_78._8_8_ + 8),*(RawSchema **)local_78._16_8_,&local_28);
    *(Dependency **)(local_78._16_8_ + 0x10) = AVar1.ptr;
    *(int *)(local_78._16_8_ + 0x1c) = (int)AVar1.size_;
    *(undefined8 *)(local_78._16_8_ + 0x20) = 0;
  }
  kj::Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::~Locked
            ((Locked<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_> *)local_78);
  return extraout_EAX;
}

Assistant:

void SchemaLoader::BrandedInitializerImpl::init(const _::RawBrandedSchema* schema) const {
  schema->generic->ensureInitialized();

  auto lock = loader.impl.lockExclusive();

  if (schema->lazyInitializer == nullptr) {
    // Never mind, someone beat us to it.
    return;
  }

  // Get the mutable version.
  _::RawBrandedSchema* mutableSchema = KJ_ASSERT_NONNULL(
      lock->get()->brands.find(SchemaBindingsPair { schema->generic, schema->scopes }));
  KJ_ASSERT(mutableSchema == schema);

  // Construct its dependency map.
  auto deps = lock->get()->makeBrandedDependencies(mutableSchema->generic,
      kj::arrayPtr(mutableSchema->scopes, mutableSchema->scopeCount));
  mutableSchema->dependencies = deps.begin();
  mutableSchema->dependencyCount = deps.size();

  // It's initialized now, so disable the initializer.
#if __GNUC__ || defined(__clang__)
  __atomic_store_n(&mutableSchema->lazyInitializer, nullptr, __ATOMIC_RELEASE);
#elif _MSC_VER
  std::atomic_thread_fence(std::memory_order_release);
  *static_cast<_::RawBrandedSchema::Initializer const* volatile*>(
      &mutableSchema->lazyInitializer) = nullptr;
#else
#error "Platform not supported"
#endif
}